

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int __thiscall AActor::GetModifiedDamage(AActor *this,FName *damagetype,int damage,bool passive)

{
  undefined8 in_RAX;
  AInventory *pAVar1;
  int local_28;
  FName local_24;
  
  _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),damage);
  pAVar1 = GC::ReadBarrier<AInventory>((AInventory **)&this->Inventory);
  if (pAVar1 != (AInventory *)0x0) {
    pAVar1 = GC::ReadBarrier<AInventory>((AInventory **)&this->Inventory);
    _local_28 = CONCAT44(damagetype->Index,local_28);
    (*(pAVar1->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x2c])
              (pAVar1,(ulong)(uint)damage,&local_24,&local_28,(ulong)passive);
    damage = local_28;
  }
  return damage;
}

Assistant:

int AActor::GetModifiedDamage(FName damagetype, int damage, bool passive)
{
	if (Inventory != nullptr)
		Inventory->ModifyDamage(damage, damagetype, damage, passive);

	return damage;
}